

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

StringRef __thiscall llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(BuildKey *this)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  bool local_3d;
  uint32_t nameSize;
  BuildKey *this_local;
  ulong local_28;
  
  bVar2 = isFilteredDirectoryContents(this);
  local_3d = true;
  if (!bVar2) {
    local_3d = isDirectoryTreeStructureSignature(this);
  }
  if (local_3d == false) {
    __assert_fail("isFilteredDirectoryContents() || isDirectoryTreeStructureSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                  ,0x101,
                  "StringRef llbuild::buildsystem::BuildKey::getFilteredDirectoryPath() const");
  }
  pcVar3 = core::KeyType::data(&this->key);
  uVar1 = *(uint *)(pcVar3 + 1);
  pcVar3 = core::KeyType::data(&this->key);
  this_local = (BuildKey *)(pcVar3 + 5);
  local_28 = (ulong)uVar1;
  return _this_local;
}

Assistant:

StringRef getFilteredDirectoryPath() const {
    assert(isFilteredDirectoryContents() || isDirectoryTreeStructureSignature());
    uint32_t nameSize;
    memcpy(&nameSize, &key.data()[1], sizeof(uint32_t));
    return StringRef(&key.data()[1 + sizeof(uint32_t)], nameSize);
  }